

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::CompactReporter::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  Colour colour;
  Colour *in_stack_ffffffffffffffe0;
  
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1c699b);
  if (bVar1) {
    std::operator<<((ostream *)*in_RDI,";");
    dimColour();
    Colour::Colour(in_stack_ffffffffffffffe0,(Code)((ulong)in_RDI >> 0x20));
    std::operator<<((ostream *)*in_RDI," expression was:");
    Colour::~Colour((Colour *)0x1c69e4);
    printOriginalExpression(this);
  }
  return;
}

Assistant:

void printExpressionWas() {
                if( result.hasExpression() ) {
                    stream << ";";
                    {
                        Colour colour( dimColour() );
                        stream << " expression was:";
                    }
                    printOriginalExpression();
                }
            }